

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O3

void __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor
          (ThreeAxisForceTorqueContactSensor *this,ThreeAxisForceTorqueContactSensor *other)

{
  ThreeAxisForceTorqueContactSensorPrivateAttributes *pTVar1;
  pointer pcVar2;
  ThreeAxisForceTorqueContactSensorPrivateAttributes *pTVar3;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__ThreeAxisForceTorqueContactSensor_00185b50;
  pTVar3 = (ThreeAxisForceTorqueContactSensorPrivateAttributes *)operator_new(0xc0);
  pTVar1 = other->pimpl;
  (pTVar3->name)._M_dataplus._M_p = (pointer)&(pTVar3->name).field_2;
  pcVar2 = (pTVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pTVar3,pcVar2,pcVar2 + (pTVar1->name)._M_string_length);
  iDynTree::Transform::Transform(&pTVar3->link_H_sensor,&pTVar1->link_H_sensor);
  pTVar3->parent_link_index = pTVar1->parent_link_index;
  (pTVar3->parent_link_name)._M_dataplus._M_p = (pointer)&(pTVar3->parent_link_name).field_2;
  pcVar2 = (pTVar1->parent_link_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar3->parent_link_name,pcVar2,
             pcVar2 + (pTVar1->parent_link_name)._M_string_length);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::vector
            (&pTVar3->m_loadCellLocations,&pTVar1->m_loadCellLocations);
  this->pimpl = pTVar3;
  return;
}

Assistant:

ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor(const ThreeAxisForceTorqueContactSensor& other):
    pimpl(new ThreeAxisForceTorqueContactSensorPrivateAttributes(*(other.pimpl)))
{

}